

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 soft_f64_muladd(float64 a,float64 b,float64 c,int flags,float_status *status)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  undefined4 in_register_0000000c;
  uint uVar9;
  int count;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  FloatParts FVar22;
  FloatParts FVar23;
  FloatParts FVar24;
  FloatParts p;
  FloatParts a_00;
  FloatParts b_00;
  uint64_t hi;
  uint64_t c_lo;
  uint64_t c_hi;
  float_status *in_stack_ffffffffffffff80;
  ulong local_70;
  ulong local_68;
  uint local_5c;
  uint64_t local_58;
  ulong local_50;
  ulong local_48;
  uint64_t local_40;
  ulong local_38;
  uint uVar5;
  
  local_50 = CONCAT44(in_register_0000000c,flags);
  FVar22._8_8_ = a >> 0x34 & 0x7ff | a >> 0x17 & 0x10000000000;
  FVar22.frac = a & 0xfffffffffffff;
  FVar22 = sf_canonicalize(FVar22,&float64_params,status);
  uVar10 = FVar22._8_8_;
  local_58 = FVar22.frac;
  FVar23.frac = b & 0xfffffffffffff;
  FVar23._8_8_ = b >> 0x34 & 0x7ff | b >> 0x17 & 0x10000000000;
  FVar23 = sf_canonicalize(FVar23,&float64_params,status);
  local_48 = FVar23.frac;
  FVar24.frac = c & 0xfffffffffffff;
  uVar11 = 0x10000000000;
  FVar24._8_8_ = c >> 0x34 & 0x7ff | c >> 0x17 & 0x10000000000;
  FVar24 = sf_canonicalize(FVar24,&float64_params,status);
  uVar17 = FVar24.frac;
  if (((((undefined1  [16])FVar22 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0) ||
      (((undefined1  [16])FVar23 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) ||
     (((undefined1  [16])FVar24 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) {
    uVar11 = FVar23._8_8_ & 0xffffffffffff;
    a_00.exp = (int)uVar10;
    a_00.cls = (char)(uVar10 >> 0x20);
    a_00.sign = (_Bool)(char)(uVar10 >> 0x28);
    a_00._14_2_ = (short)(uVar10 >> 0x30);
    a_00.frac = local_58;
    b_00.exp = (int)uVar11;
    b_00.cls = (char)(uVar11 >> 0x20);
    b_00.sign = (_Bool)(char)(uVar11 >> 0x28);
    b_00._14_2_ = (short)(uVar11 >> 0x30);
    b_00.frac = local_48;
    p = pick_nan_muladd(a_00,b_00,FVar24,SUB81(status,0),in_stack_ffffffffffffff80);
    goto LAB_00cfb670;
  }
  uVar8 = FVar23._12_4_ & 0xff;
  uVar9 = FVar22._12_4_ & 0xff;
  if ((1 << (FVar23.cls & 0x1f) | 1 << (FVar22._12_4_ & 0x1f)) != 10) {
    uVar15 = (uint)local_50;
    uVar19 = FVar24._8_8_ & 0xffff0103ffffffff ^ 0x10000000000;
    if ((local_50 & 1) == 0) {
      uVar19 = FVar24._8_8_;
    }
    uVar6 = (FVar23._8_8_ ^ uVar10) & 0x10000000000;
    uVar13 = (ulong)(uVar6 == 0);
    if ((local_50 & 2) == 0) {
      uVar13 = uVar6 >> 0x28;
    }
    bVar20 = uVar9 != 3;
    bVar21 = uVar8 != 3;
    uVar16 = uVar15 & 4;
    uVar5 = (uint)(uVar19 >> 0x20);
    uVar4 = uVar5 & 3;
    uVar12 = (uint)uVar13;
    if (uVar4 != 3) {
      if (!bVar21 || !bVar20) {
        if (uVar16 >> 2 == uVar12) {
          uVar11 = 0;
        }
        goto LAB_00cfb791;
      }
      uVar18 = (uint)uVar19;
      if ((bVar21 && bVar20) && (uVar8 == 1 || uVar9 == 1)) {
        if (uVar4 == 1) {
          if ((uVar5 >> 8 & 1) != uVar12) {
            uVar13 = (ulong)(status->float_rounding_mode == '\x01');
          }
          uVar19 = uVar19 & 0xffff0003ffffffff | uVar13 << 0x28;
        }
        else if ((local_50 & 8) != 0) {
          uVar19 = uVar19 & 0xffffff0300000000 | (ulong)(uVar18 - 1);
        }
        if (((uint)(uVar19 >> 0x28) & 1) == uVar16 >> 2) {
          uVar11 = 0;
        }
        uVar11 = uVar19 & 0xffff00ffffffffff | uVar11;
        p.exp = (int)uVar11;
        p.cls = (char)(uVar11 >> 0x20);
        p.sign = (_Bool)(char)(uVar11 >> 0x28);
        p._14_2_ = (short)(uVar11 >> 0x30);
        p.frac = uVar17;
        goto LAB_00cfb670;
      }
      if ((uVar9 != 2) || (uVar8 != 2)) {
        __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                      ,0x58e,
                      "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                     );
      }
      uVar14 = (local_58 & 0xffffffff) * (local_48 >> 0x20);
      uVar11 = (local_48 & 0xffffffff) * (local_58 >> 0x20);
      uVar6 = uVar11 + uVar14;
      local_70 = local_48 * local_58;
      local_68 = (uVar6 >> 0x20) + (local_48 >> 0x20) * (local_58 >> 0x20) +
                 ((ulong)CARRY8(uVar11,uVar14) << 0x20) + (ulong)(local_70 < uVar6 << 0x20);
      uVar8 = FVar23.exp + FVar22.exp;
      if ((local_68 >> 0x3d & 1) != 0) {
        local_70 = (ulong)((uint)local_70 & 1) | local_68 << 0x3f | local_70 >> 1;
        local_68 = local_68 >> 1;
        uVar8 = uVar8 + 1;
      }
      if (uVar4 == 1) {
        local_70 = (ulong)((local_70 & 0x3fffffffffffffff) != 0) | local_68 << 2 | local_70 >> 0x3e;
        local_68 = local_68 >> 0x3e;
      }
      else {
        count = uVar8 - uVar18;
        local_5c = uVar16;
        if ((uVar5 >> 8 & 1) == uVar12) {
          if (count < 1) {
            uVar11 = local_70;
            shift128RightJamming(local_68,local_70,0x3e - count,&local_68,&local_70);
            local_70 = local_70 + uVar17;
          }
          else {
            local_38 = uVar17 >> 2;
            local_40 = 0;
            shift128RightJamming(local_38,0,count,&local_38,&local_40);
            local_68 = local_38 + local_68 + (ulong)CARRY8(local_40,local_70);
            uVar11 = (ulong)((local_40 + local_70 & 0x3fffffffffffffff) != 0) |
                     local_68 * 4 | local_40 + local_70 >> 0x3e;
            local_68 = local_68 >> 0x3e;
            uVar19 = (ulong)uVar8;
            local_70 = uVar11;
          }
          uVar8 = (uint)uVar19;
          bVar20 = true;
          uVar15 = (uint)local_50;
          if ((long)local_70 < 0) {
            local_70 = (ulong)((uint)local_70 & 1) | local_70 >> 1;
            uVar8 = uVar8 + 1;
          }
        }
        else {
          uVar17 = uVar17 >> 2;
          local_40 = 0;
          local_38 = uVar17;
          if (count < 1) {
            shift128RightJamming(local_68,local_70,-count,&local_68,&local_70);
            if ((uVar8 == uVar18) && (uVar11 = local_68 - uVar17, uVar17 <= local_68))
            goto LAB_00cfba13;
            bVar20 = local_70 != 0;
            local_70 = -local_70;
            local_68 = (uVar17 - local_68) - (ulong)bVar20;
            uVar12 = (uint)(byte)((byte)uVar13 ^ 1);
          }
          else {
            shift128RightJamming(uVar17,0,count,&local_38,&local_40);
            bVar20 = local_70 < local_40;
            local_70 = local_70 - local_40;
            uVar11 = (local_68 - local_38) - (ulong)bVar20;
LAB_00cfba13:
            local_68 = uVar11;
            uVar19 = (ulong)uVar8;
          }
          uVar8 = (uint)uVar19;
          bVar20 = local_68 != 0 || local_70 != 0;
          uVar15 = (uint)local_50;
          if (local_68 == 0 && local_70 == 0) {
            uVar11 = 0;
            if (local_5c >> 2 != (uint)(status->float_rounding_mode == '\x01')) {
              uVar11 = 0x10000000000;
            }
            uVar11 = uVar10 & 0xffff0000ffffffff | 0x100000000 | uVar11;
            uVar10 = uVar11;
          }
          else {
            lVar1 = 0x3f;
            if (local_68 != 0) {
              for (; local_68 >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            if (local_70 == 0) {
              uVar9 = 0x40;
            }
            else {
              lVar2 = 0x3f;
              if (local_70 != 0) {
                for (; local_70 >> lVar2 == 0; lVar2 = lVar2 + -1) {
                }
              }
              uVar9 = (uint)lVar2 ^ 0x3f;
            }
            uVar16 = (uint)lVar1 ^ 0x3f;
            if (local_68 == 0) {
              uVar16 = uVar9 + 0x40;
            }
            if (uVar16 < 0x41) {
              bVar7 = (char)uVar16 - 1;
              bVar3 = bVar7 & 0x3f;
              local_68 = local_68 << bVar3 | local_70 >> 0x40 - bVar3;
              uVar11 = local_70 << (bVar7 & 0x3f) != 0 | local_68;
            }
            else {
              uVar11 = local_70 << ((char)uVar16 + 0xbfU & 0x3f);
            }
            uVar8 = (uVar8 - uVar16) + 3;
            local_70 = uVar11;
          }
        }
        p.exp = (int)uVar11;
        p.cls = (char)(uVar11 >> 0x20);
        p.sign = (_Bool)(char)(uVar11 >> 0x28);
        p._14_2_ = (short)(uVar11 >> 0x30);
        p.frac = local_58;
        uVar16 = local_5c;
        if (!bVar20) goto LAB_00cfb670;
      }
      uVar11 = 0x10000000000;
      if (uVar16 >> 2 == uVar12) {
        uVar11 = 0;
      }
      uVar11 = (ulong)(((int)(uVar15 << 0x1c) >> 0x1f) + uVar8) | uVar10 & 0xffff000000000000 |
               uVar11 | 0x200000000;
      p.exp = (int)uVar11;
      p.cls = (char)(uVar11 >> 0x20);
      p.sign = (_Bool)(char)(uVar11 >> 0x28);
      p._14_2_ = (short)(uVar11 >> 0x30);
      p.frac = local_70;
      goto LAB_00cfb670;
    }
    if ((bVar21 && bVar20) || ((uVar5 >> 8 & 1) == uVar12)) {
      if ((uVar5 >> 8 & 1) == uVar16 >> 2) {
        uVar11 = 0;
      }
LAB_00cfb791:
      uVar11 = uVar10 & 0xffff0000ffffffff | 0x300000000 | uVar11;
      p.exp = (int)uVar11;
      p.cls = (char)(uVar11 >> 0x20);
      p.sign = (_Bool)(char)(uVar11 >> 0x28);
      p._14_2_ = (short)(uVar11 >> 0x30);
      p.frac = local_58;
      goto LAB_00cfb670;
    }
  }
  p.exp = 0x7fffffff;
  p.cls = float_class_qnan;
  p.sign = false;
  p._14_2_ = 0;
  p.frac = 0x2000000000000000;
  status->float_exception_flags = status->float_exception_flags | 1;
LAB_00cfb670:
  FVar22 = round_canonical(p,status,&float64_params);
  return FVar22.frac & 0xfffffffffffff | (ulong)(FVar22.exp & 0x7ff) << 0x34 |
         (FVar22._8_8_ & 0x10000000000) << 0x17;
}

Assistant:

static float64 QEMU_SOFTFLOAT_ATTR
soft_f64_muladd(float64 a, float64 b, float64 c, int flags,
                float_status *status)
{
    FloatParts pa = float64_unpack_canonical(a, status);
    FloatParts pb = float64_unpack_canonical(b, status);
    FloatParts pc = float64_unpack_canonical(c, status);
    FloatParts pr = muladd_floats(pa, pb, pc, flags, status);

    return float64_round_pack_canonical(pr, status);
}